

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O1

_Bool test_mul(void)

{
  uint8_t **ppuVar1;
  uint8_t **__return_storage_ptr__;
  int iVar2;
  uint uVar3;
  int i;
  long lVar4;
  _Bool _Var5;
  undefined7 local_1f8;
  undefined1 uStack_1f1;
  undefined7 uStack_1f0;
  undefined1 uStack_1e9;
  uint8_t local_1e8 [8];
  undefined8 uStack_1e0;
  uint8_t local_1d8 [8];
  undefined8 uStack_1d0;
  undefined7 local_1c8;
  undefined1 uStack_1c1;
  undefined7 uStack_1c0;
  undefined1 uStack_1b9;
  uint8_t local_1b8 [40];
  undefined8 uStack_190;
  uint8_t local_188 [24];
  undefined8 uStack_170;
  uint8_t local_168 [40];
  undefined8 uStack_140;
  uint8_t local_138 [48];
  undefined1 local_108 [8];
  m256v C;
  m256v ApB;
  m256v R1;
  m256v AC;
  m256v BC;
  m256v R2;
  m256v A;
  m256v B;
  
  _Var5 = false;
  uVar3 = 0;
  while( true ) {
    lVar4 = 0;
    do {
      uStack_140 = 0x102105;
      iVar2 = rand();
      local_138[lVar4] = (uint8_t)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x23);
    uStack_140 = 0x102129;
    m256v_make((m256v *)&R2.e,5,7,local_138);
    lVar4 = 0;
    do {
      uStack_170 = 0x10213b;
      iVar2 = rand();
      local_168[lVar4] = (uint8_t)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x23);
    uStack_170 = 0x10215f;
    m256v_make((m256v *)&A.e,5,7,local_168);
    lVar4 = 0;
    do {
      uStack_190 = 0x102171;
      iVar2 = rand();
      local_188[lVar4] = (uint8_t)iVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x15);
    uStack_190 = 0x10219b;
    m256v_make((m256v *)local_108,7,3,local_188);
    ppuVar1 = &C.e;
    uStack_1c0 = 0x1021bc;
    uStack_1b9 = 0;
    m256v_make((m256v *)ppuVar1,5,7,local_1b8);
    uStack_1c0 = 0x1021cf;
    uStack_1b9 = 0;
    m256v_add((m256v *)&R2.e,(m256v *)&A.e,(m256v *)ppuVar1);
    uStack_1d0 = 0x1021f2;
    m256v_make((m256v *)&ApB.e,5,3,(uint8_t *)&local_1c8);
    uStack_1d0 = 0x102200;
    m256v_mul((m256v *)ppuVar1,(m256v *)local_108,(m256v *)&ApB.e);
    ppuVar1 = &R1.e;
    uStack_1e0 = 0x102221;
    m256v_make((m256v *)ppuVar1,5,3,local_1d8);
    uStack_1e0 = 0x10222f;
    m256v_mul((m256v *)&R2.e,(m256v *)local_108,(m256v *)ppuVar1);
    __return_storage_ptr__ = &AC.e;
    uStack_1f0 = 0x102250;
    uStack_1e9 = 0;
    m256v_make((m256v *)__return_storage_ptr__,5,3,local_1e8);
    uStack_1f0 = 0x10225f;
    uStack_1e9 = 0;
    m256v_mul((m256v *)&A.e,(m256v *)local_108,(m256v *)__return_storage_ptr__);
    m256v_make((m256v *)&BC.e,5,3,(uint8_t *)&local_1f8);
    m256v_add((m256v *)ppuVar1,(m256v *)__return_storage_ptr__,(m256v *)&BC.e);
    if (CONCAT71(uStack_1c0,uStack_1c1) != CONCAT71(uStack_1f0,uStack_1f1) ||
        CONCAT17(uStack_1c1,local_1c8) != CONCAT17(uStack_1f1,local_1f8)) break;
    _Var5 = 0x3e6 < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 1000) {
      return _Var5;
    }
  }
  fprintf(_stderr,"%s:%d:  Multiplication is not distributive.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/unit_tests/m256v_basic.c"
          ,0x188);
  return _Var5;
}

Assistant:

static bool test_mul()
{
	/* Random checks:  Verify distributivity */

	/* We verify the identity (A + B)*C = A*C + B*C */
	for (int i = 0; i < 1000; ++i) {
		const int dim1 = 5, dim2 = 7, dim3 = 3;

		/* Create matrices */
		Def_mat256_rand(A, a, dim1, dim2, 0xff)
		Def_mat256_rand(B, b, dim1, dim2, 0xff)
		Def_mat256_rand(C, c, dim2, dim3, 0xff)

		/* Compute R1 := (A + B)*C */
		m256v_Def(ApB, apb, dim1, dim2)
		m256v_add(&A, &B, &ApB);
		m256v_Def(R1, r1, dim1, dim3)
		m256v_mul(&ApB, &C, &R1);

		/* Compute R2 := A*C + B*C */
		m256v_Def(AC, ac, dim1, dim3)
		m256v_mul(&A, &C, &AC);
		m256v_Def(BC, bc, dim1, dim3)
		m256v_mul(&B, &C, &BC);
		m256v_Def(R2, r2, dim1, dim3)
		m256v_add(&AC, &BC, &R2);

		/* Make sure R1 = R2 */
		if (memcmp(r1, r2, sizeof(r2)) != 0) {
			fprintf(stderr,
			  "%s:%d:  Multiplication is not distributive.\n",
			  __FILE__, __LINE__);
			return false;
		}
	}

	return true;
}